

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O2

Abc_Obj_t * Io_MvParseAddResetCircuit(Io_MvMod_t *p,char *pName)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pObj;
  char *pcVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  void *pvVar5;
  Io_MvVar_t *pIVar6;
  Io_MvVar_t *pV;
  Abc_Obj_t *pFanin;
  char Buffer [50];
  
  pAVar1 = p->pResetLatch;
  if (pAVar1 != (Abc_Obj_t *)0x0) {
    plVar2 = (long *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray];
    pAVar1 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8)
    ;
    pObj = Abc_NtkFindOrCreateNet(p->pNtk,pName);
    pAVar3 = p->pNtk;
    pcVar4 = Abc_ObjNameSuffix(pObj,"_reset");
    pObj_00 = Abc_NtkFindOrCreateNet(pAVar3,pcVar4);
    pAVar3 = p->pNtk;
    pcVar4 = Abc_ObjNameSuffix(pObj,"_out");
    pObj_01 = Abc_NtkFindOrCreateNet(pAVar3,pcVar4);
    pvVar5 = Abc_NtkMvVar(p->pNtk);
    if (pvVar5 != (void *)0x0) {
      pIVar6 = (Io_MvVar_t *)Abc_ObjMvVar(pObj);
      pV = Abc_NtkMvVarDup(p->pNtk,pIVar6);
      Abc_ObjSetMvVar(pObj_00,pV);
      pIVar6 = Abc_NtkMvVarDup(p->pNtk,pIVar6);
      Abc_ObjSetMvVar(pObj_01,pIVar6);
    }
    pFanin = Abc_NtkCreateObj(p->pNtk,ABC_OBJ_NODE);
    Abc_ObjAddFanin(pObj,pFanin);
    if (p->pMan->fBlifMv == 0) {
      pcVar4 = Abc_SopCreateMux((Mem_Flex_t *)p->pNtk->pManFunc);
    }
    else {
      builtin_strncpy(Buffer,"1 - - =1\n0 - - =2\n",0x13);
      pcVar4 = Abc_SopRegister((Mem_Flex_t *)p->pNtk->pManFunc,Buffer);
    }
    (pFanin->field_5).pData = pcVar4;
    Abc_ObjAddFanin(pFanin,pAVar1);
    Abc_ObjAddFanin(pFanin,pObj_01);
    Abc_ObjAddFanin(pFanin,pObj_00);
    return pObj_00;
  }
  __assert_fail("p->pResetLatch != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlifMv.c"
                ,0x706,"Abc_Obj_t *Io_MvParseAddResetCircuit(Io_MvMod_t *, char *)");
}

Assistant:

static Abc_Obj_t * Io_MvParseAddResetCircuit( Io_MvMod_t * p, char * pName )
{
    char Buffer[50];
    Abc_Obj_t * pNode, * pData0Net, * pData1Net, * pResetLONet, * pOutNet;
    Io_MvVar_t * pVar;
    // make sure the reset latch exists
    assert( p->pResetLatch != NULL );
    // get the reset net
    pResetLONet = Abc_ObjFanout0(Abc_ObjFanout0(p->pResetLatch));
    // get the output net
    pOutNet = Abc_NtkFindOrCreateNet( p->pNtk, pName );
    // get the data nets
    pData0Net = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pOutNet, "_reset") );
    pData1Net = Abc_NtkFindOrCreateNet( p->pNtk, Abc_ObjNameSuffix(pOutNet, "_out") );
    // duplicate MV variables
    if ( Abc_NtkMvVar(p->pNtk) )
    {
        pVar = (Io_MvVar_t *)Abc_ObjMvVar( pOutNet );
        Abc_ObjSetMvVar( pData0Net, Abc_NtkMvVarDup(p->pNtk, pVar) );
        Abc_ObjSetMvVar( pData1Net, Abc_NtkMvVarDup(p->pNtk, pVar) );
    }
    // create the node
    pNode = Abc_NtkCreateNode( p->pNtk );
    // create the output net
    Abc_ObjAddFanin( pOutNet, pNode );
    // create the function
    if ( p->pMan->fBlifMv )
    {
//        Vec_Att_t * p = Abc_NtkMvVar( pNtk );
//        int nValues = Abc_ObjMvVarNum(pOutNet);
//        sprintf( Buffer, "2 %d %d %d\n1 - - =1\n0 - - =2\n", nValues, nValues, nValues );
        sprintf( Buffer, "1 - - =1\n0 - - =2\n" );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pNtk->pManFunc, Buffer );
    }
    else
        pNode->pData = Abc_SopCreateMux( (Mem_Flex_t *)p->pNtk->pManFunc );
    // add nets
    Abc_ObjAddFanin( pNode, pResetLONet );
    Abc_ObjAddFanin( pNode, pData1Net );
    Abc_ObjAddFanin( pNode, pData0Net );
    return pData0Net;
}